

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestJsonName_Test::
~DescriptorPoolTypeResolverTest_TestJsonName_Test
          (DescriptorPoolTypeResolverTest_TestJsonName_Test *this)

{
  DescriptorPoolTypeResolverTest_TestJsonName_Test *this_local;
  
  DescriptorPoolTypeResolverTest::~DescriptorPoolTypeResolverTest
            (&this->super_DescriptorPoolTypeResolverTest);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestJsonName) {
  Type type;
  ASSERT_TRUE(resolver_
                  ->ResolveMessageType(
                      GetTypeUrl<proto2_unittest::TestAllTypes>(), &type)
                  .ok());
  EXPECT_EQ("optionalInt32", FindField(type, "optional_int32")->json_name());

  ASSERT_TRUE(
      resolver_
          ->ResolveMessageType(GetTypeUrl<proto3::TestCustomJsonName>(), &type)
          .ok());
  EXPECT_EQ("@value", FindField(type, "value")->json_name());
}